

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O2

int __thiscall
CVmImageLoader::restore_synth_exports(CVmImageLoader *this,CVmFile *fp,CVmObjFixup *fixups)

{
  CVmHashTable *this_00;
  uint uVar1;
  ulong uVar2;
  long lVar3;
  CVmHashEntryExport *this_01;
  size_t buflen;
  size_t len;
  bool bVar4;
  char dh [5];
  vm_val_t val;
  char buf [256];
  
  discard_synth_exports(G_image_loader_X);
  uVar2 = CVmFile::read_uint4(fp);
  while (bVar4 = uVar2 != 0, uVar2 = uVar2 - 1, bVar4) {
    uVar1 = CVmFile::read_uint2(fp);
    len = (size_t)uVar1;
    buflen = 0x100;
    if (uVar1 < 0x100) {
      buflen = (size_t)uVar1;
    }
    CVmFile::read_bytes(fp,buf,buflen);
    if (0x100 < uVar1) {
      lVar3 = CVmFile::get_pos(fp);
      CVmFile::set_pos(fp,len + lVar3 + -0x100);
      len = 0x100;
    }
    CVmFile::read_bytes(fp,dh,5);
    CVmObjFixup::fix_dh(fixups,dh);
    vmb_get_dh(dh,&val);
    this_00 = this->synth_exports_;
    this_01 = (CVmHashEntryExport *)operator_new(0x38);
    CVmHashEntryExport::CVmHashEntryExport(this_01,buf,len,1,&val);
    CVmHashTable::add(this_00,(CVmHashEntry *)this_01);
  }
  return 0;
}

Assistant:

int CVmImageLoader::restore_synth_exports(VMG_ CVmFile *fp,
                                          CVmObjFixup *fixups)
{
    long cnt;
    
    /* 
     *   discard the old synthesized exports - we want to entirely replace
     *   these with what we're about to load from the file 
     */
    G_image_loader->discard_synth_exports();

    /* read the number of synthesized exports */
    cnt = fp->read_uint4();

    /* read the exports */
    for ( ; cnt != 0 ; --cnt)
    {
        size_t len;
        char buf[256];
        char dh[VMB_DATAHOLDER];
        vm_val_t val;
        
        /* read the length of the name and the name */
        len = fp->read_uint2();
        fp->read_bytes(buf, len > sizeof(buf) ? sizeof(buf) : len);

        /* skip any part of the name that didn't fit in the buffer */
        if (len > sizeof(buf))
        {
            /* skip the extra bytes */
            fp->set_pos(fp->get_pos() + (len - sizeof(buf)));

            /* limit the length we use to the buffer size */
            len = sizeof(buf);
        }

        /* read the value */
        fp->read_bytes(dh, VMB_DATAHOLDER);

        /* if the value is an object reference, fix it up */
        fixups->fix_dh(vmg_ dh);

        /* get the value */
        vmb_get_dh(dh, &val);

        /* add the export */
        synth_exports_->add(new CVmHashEntryExport(buf, len, TRUE, &val));
    }

    /* success */
    return 0;
}